

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_contracthashutil.cpp
# Opt level: O0

void __thiscall
ContractHashUtil_GetContractScriptFailFedpegScript_Test::
ContractHashUtil_GetContractScriptFailFedpegScript_Test
          (ContractHashUtil_GetContractScriptFailFedpegScript_Test *this)

{
  ContractHashUtil_GetContractScriptFailFedpegScript_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ContractHashUtil_GetContractScriptFailFedpegScript_Test_00676188;
  return;
}

Assistant:

TEST(ContractHashUtil, GetContractScriptFailFedpegScript) {
  Script claim_script("0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb");
  Script script;
  for (const auto& script_data : fedpeg_fail_test_vectors) {
    EXPECT_NO_THROW(
        (script = ContractHashUtil::GetContractScript(claim_script,
            Script(script_data.fedpeg_script))));
    EXPECT_STREQ(script.GetHex().c_str(), script_data.contract_script.c_str());
  }
}